

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O2

bool __thiscall pg::TLQSolver::attracts(TLQSolver *this,int pl,int v,bitset *Z,bitset *R)

{
  Game *pGVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  
  iVar4 = Solver::owner(&this->super_Solver,v);
  pGVar1 = (this->super_Solver).game;
  piVar5 = pGVar1->_outedges + pGVar1->_firstouts[v];
  if (iVar4 == pl) {
    do {
      uVar6 = (ulong)*piVar5;
      bVar3 = uVar6 != 0xffffffffffffffff;
      if (uVar6 == 0xffffffffffffffff) {
        return bVar3;
      }
      piVar5 = piVar5 + 1;
    } while ((Z->_bits[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0);
  }
  else {
    bVar3 = false;
    for (; uVar6 = (ulong)*piVar5, uVar6 != 0xffffffffffffffff; piVar5 = piVar5 + 1) {
      bVar2 = true;
      if (((Z->_bits[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0) &&
         (bVar2 = bVar3, (R->_bits[uVar6 >> 6] & 1L << (uVar6 & 0x3f)) != 0)) {
        return false;
      }
      bVar3 = bVar2;
    }
  }
  return bVar3;
}

Assistant:

bool
TLQSolver::attracts(const int pl, const int v, bitset &Z, bitset &R)
{
    if (owner(v) == pl) {
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            if (Z[*curedge]) return true;
        }
        return false;
    } else {
        bool hasZ = false;
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            int to = *curedge;
            if (Z[to]) { hasZ = true; continue; }
            if (R[to]) return false;
        }
        return hasZ;
    }
}